

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtosc.c
# Opt level: O0

size_t rtosc_amessage(char *buffer,size_t len,char *address,char *arguments,rtosc_arg_t *args)

{
  undefined4 uVar1;
  undefined8 uVar2;
  undefined1 *puVar3;
  undefined8 *puVar4;
  char *in_RCX;
  char *pcVar5;
  char *pcVar6;
  char *in_RDX;
  uint uVar7;
  ulong in_RSI;
  void *in_RDI;
  long in_R8;
  rtosc_blob_t b;
  uchar *u;
  char *s;
  uint8_t *m;
  int64_t d;
  int32_t i;
  char arg;
  uint arg_pos;
  uint toparse;
  char *arg_str;
  uint pos;
  size_t total_len;
  char *in_stack_ffffffffffffff70;
  int local_88;
  undefined1 *local_78;
  rtosc_arg_t *in_stack_ffffffffffffff90;
  char *in_stack_ffffffffffffff98;
  char *in_stack_ffffffffffffffa0;
  int local_58;
  uint local_50;
  uint local_4c;
  char *local_48;
  uint local_3c;
  char *local_28;
  char *local_20;
  size_t local_8;
  
  local_8 = vsosc_null(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90
                      );
  if (in_RDI != (void *)0x0) {
    if (in_RSI < local_8) {
      memset(in_RDI,0,in_RSI);
      local_8 = 0;
    }
    else {
      memset(in_RDI,0,local_8);
      local_3c = 0;
      local_20 = in_RDX;
      while (*local_20 != '\0') {
        *(char *)((long)in_RDI + (ulong)local_3c) = *local_20;
        local_3c = local_3c + 1;
        local_20 = local_20 + 1;
      }
      local_3c = (4 - (local_3c & 3)) + local_3c;
      *(undefined1 *)((long)in_RDI + (ulong)local_3c) = 0x2c;
      local_48 = in_RCX;
      while (local_3c = local_3c + 1, *local_48 != '\0') {
        *(char *)((long)in_RDI + (ulong)local_3c) = *local_48;
        local_48 = local_48 + 1;
      }
      local_3c = (4 - (local_3c & 3)) + local_3c;
      local_4c = nreserved(in_stack_ffffffffffffff70);
      local_50 = 0;
      local_28 = in_RCX;
      while (local_4c != 0) {
        pcVar5 = local_28 + 1;
        switch(*local_28) {
        case 'S':
        case 's':
          for (pcVar6 = *(char **)(in_R8 + (ulong)local_50 * 0x10); *pcVar6 != '\0';
              pcVar6 = pcVar6 + 1) {
            *(char *)((long)in_RDI + (ulong)local_3c) = *pcVar6;
            local_3c = local_3c + 1;
          }
          local_3c = (4 - (local_3c & 3)) + local_3c;
          local_4c = local_4c - 1;
          local_50 = local_50 + 1;
          local_28 = pcVar5;
          break;
        default:
          local_28 = pcVar5;
          break;
        case 'b':
          puVar4 = (undefined8 *)(in_R8 + (ulong)local_50 * 0x10);
          uVar2 = *puVar4;
          local_78 = (undefined1 *)puVar4[1];
          local_88 = (int)uVar2;
          local_58 = local_88;
          *(char *)((long)in_RDI + (ulong)local_3c) = (char)((ulong)uVar2 >> 0x18);
          *(char *)((long)in_RDI + (ulong)(local_3c + 1)) = (char)((ulong)uVar2 >> 0x10);
          uVar7 = local_3c + 3;
          *(char *)((long)in_RDI + (ulong)(local_3c + 2)) = (char)((ulong)uVar2 >> 8);
          local_3c = local_3c + 4;
          *(char *)((long)in_RDI + (ulong)uVar7) = (char)uVar2;
          if (local_78 == (undefined1 *)0x0) {
            local_3c = local_88 + local_3c;
          }
          else {
            while (local_58 != 0) {
              *(undefined1 *)((long)in_RDI + (ulong)local_3c) = *local_78;
              local_78 = local_78 + 1;
              local_58 = local_58 + -1;
              local_3c = local_3c + 1;
            }
          }
          if ((local_3c & 3) != 0) {
            local_3c = (4 - (local_3c & 3)) + local_3c;
          }
          local_4c = local_4c - 1;
          local_50 = local_50 + 1;
          local_28 = pcVar5;
          break;
        case 'c':
        case 'f':
        case 'i':
        case 'r':
          uVar1 = *(undefined4 *)(in_R8 + (ulong)local_50 * 0x10);
          *(char *)((long)in_RDI + (ulong)local_3c) = (char)((uint)uVar1 >> 0x18);
          *(char *)((long)in_RDI + (ulong)(local_3c + 1)) = (char)((uint)uVar1 >> 0x10);
          uVar7 = local_3c + 3;
          *(char *)((long)in_RDI + (ulong)(local_3c + 2)) = (char)((uint)uVar1 >> 8);
          local_3c = local_3c + 4;
          *(char *)((long)in_RDI + (ulong)uVar7) = (char)uVar1;
          local_4c = local_4c - 1;
          local_50 = local_50 + 1;
          local_28 = pcVar5;
          break;
        case 'd':
        case 'h':
        case 't':
          uVar2 = *(undefined8 *)(in_R8 + (ulong)local_50 * 0x10);
          *(char *)((long)in_RDI + (ulong)local_3c) = (char)((ulong)uVar2 >> 0x38);
          *(char *)((long)in_RDI + (ulong)(local_3c + 1)) = (char)((ulong)uVar2 >> 0x30);
          *(char *)((long)in_RDI + (ulong)(local_3c + 2)) = (char)((ulong)uVar2 >> 0x28);
          *(char *)((long)in_RDI + (ulong)(local_3c + 3)) = (char)((ulong)uVar2 >> 0x20);
          *(char *)((long)in_RDI + (ulong)(local_3c + 4)) = (char)((ulong)uVar2 >> 0x18);
          *(char *)((long)in_RDI + (ulong)(local_3c + 5)) = (char)((ulong)uVar2 >> 0x10);
          uVar7 = local_3c + 7;
          *(char *)((long)in_RDI + (ulong)(local_3c + 6)) = (char)((ulong)uVar2 >> 8);
          local_3c = local_3c + 8;
          *(char *)((long)in_RDI + (ulong)uVar7) = (char)uVar2;
          local_4c = local_4c - 1;
          local_50 = local_50 + 1;
          local_28 = pcVar5;
          break;
        case 'm':
          puVar3 = (undefined1 *)(in_R8 + (ulong)local_50 * 0x10);
          *(undefined1 *)((long)in_RDI + (ulong)local_3c) = *puVar3;
          *(undefined1 *)((long)in_RDI + (ulong)(local_3c + 1)) = puVar3[1];
          uVar7 = local_3c + 3;
          *(undefined1 *)((long)in_RDI + (ulong)(local_3c + 2)) = puVar3[2];
          local_3c = local_3c + 4;
          *(undefined1 *)((long)in_RDI + (ulong)uVar7) = puVar3[3];
          local_4c = local_4c - 1;
          local_50 = local_50 + 1;
          local_28 = pcVar5;
        }
      }
      local_8 = (size_t)local_3c;
    }
  }
  return local_8;
}

Assistant:

size_t rtosc_amessage(char              *buffer,
                      size_t             len,
                      const char        *address,
                      const char        *arguments,
                      const rtosc_arg_t *args)
{
    const size_t total_len = vsosc_null(address, arguments, args);

    if(!buffer)
        return total_len;

    //Abort if the message cannot fit
    if(total_len>len) {
        memset(buffer, 0, len);
        return 0;
    }

    memset(buffer, 0, total_len);

    unsigned pos = 0;
    while(*address)
        buffer[pos++] = *address++;

    //get 32 bit alignment
    pos += 4-pos%4;

    buffer[pos++] = ',';

    const char *arg_str = arguments;
    while(*arg_str)
        buffer[pos++] = *arg_str++;

    pos += 4-pos%4;

    unsigned toparse = nreserved(arguments);
    unsigned arg_pos = 0;
    while(toparse)
    {
        char arg = *arguments++;
        assert(arg);
        int32_t i;
        int64_t d;
        const uint8_t *m;
        const char *s;
        const unsigned char *u;
        rtosc_blob_t b;
        switch(arg) {
            case 'h':
            case 't':
            case 'd':
                d = args[arg_pos++].t;
                buffer[pos++] = ((d>>56) & 0xff);
                buffer[pos++] = ((d>>48) & 0xff);
                buffer[pos++] = ((d>>40) & 0xff);
                buffer[pos++] = ((d>>32) & 0xff);
                buffer[pos++] = ((d>>24) & 0xff);
                buffer[pos++] = ((d>>16) & 0xff);
                buffer[pos++] = ((d>>8) & 0xff);
                buffer[pos++] = (d & 0xff);
                --toparse;
                break;
            case 'r':
            case 'f':
            case 'c':
            case 'i':
                i = args[arg_pos++].i;
                buffer[pos++] = ((i>>24) & 0xff);
                buffer[pos++] = ((i>>16) & 0xff);
                buffer[pos++] = ((i>>8) & 0xff);
                buffer[pos++] = (i & 0xff);
                --toparse;
                break;
            case 'm':
                //TODO verify ordering of spec
                m = args[arg_pos++].m;
                buffer[pos++] = m[0];
                buffer[pos++] = m[1];
                buffer[pos++] = m[2];
                buffer[pos++] = m[3];
                --toparse;
                break;
            case 'S':
            case 's':
                s = args[arg_pos++].s;
                while(*s)
                    buffer[pos++] = *s++;
                pos += 4-pos%4;
                --toparse;
                break;
            case 'b':
                b = args[arg_pos++].b;
                i = b.len;
                buffer[pos++] = ((i>>24) & 0xff);
                buffer[pos++] = ((i>>16) & 0xff);
                buffer[pos++] = ((i>>8) & 0xff);
                buffer[pos++] = (i & 0xff);
                u = b.data;
                if(u) {
                    while(i--)
                        buffer[pos++] = *u++;
                }
                else
                    pos += i;
                if(pos%4)
                    pos += 4-pos%4;
                --toparse;
                break;
            default:
                ;
        }
    }

    return pos;
}